

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

int mbedtls_blowfish_setkey(mbedtls_blowfish_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t datar;
  uint32_t datal;
  uint32_t local_38 [2];
  
  iVar2 = -0x16;
  if ((keybits & 7) == 0 && keybits - 0x20 < 0x1a1) {
    lVar4 = 0;
    do {
      memcpy((void *)((long)ctx->S[0] + lVar4),(void *)((long)S[0] + lVar4),0x400);
      lVar4 = lVar4 + 0x400;
    } while (lVar4 != 0x1000);
    lVar4 = 0;
    uVar1 = 0;
    do {
      iVar2 = 4;
      uVar3 = 0;
      do {
        uVar5 = (ulong)uVar1;
        uVar1 = uVar1 + 1;
        uVar3 = (uint)key[uVar5] | uVar3 << 8;
        if (keybits >> 3 <= uVar1) {
          uVar1 = 0;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      ctx->P[lVar4] = uVar3 ^ P[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x12);
    local_38[0] = 0;
    local_38[1] = 0;
    uVar5 = 0xfffffffffffffffe;
    do {
      blowfish_enc(ctx,local_38 + 1,local_38);
      ctx->P[uVar5 + 2] = local_38[1];
      ctx->P[uVar5 + 3] = local_38[0];
      uVar5 = uVar5 + 2;
    } while (uVar5 < 0x10);
    puVar6 = ctx->S[0] + 1;
    lVar4 = 0;
    do {
      uVar5 = 0xfffffffffffffffe;
      do {
        blowfish_enc(ctx,local_38 + 1,local_38);
        puVar6[uVar5 + 1] = local_38[1];
        puVar6[uVar5 + 2] = local_38[0];
        uVar5 = uVar5 + 2;
      } while (uVar5 < 0xfe);
      lVar4 = lVar4 + 1;
      puVar6 = puVar6 + 0x100;
    } while (lVar4 != 4);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_blowfish_setkey( mbedtls_blowfish_context *ctx,
                             const unsigned char *key,
                             unsigned int keybits )
{
    unsigned int i, j, k;
    uint32_t data, datal, datar;
    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( key != NULL );

    if( keybits < MBEDTLS_BLOWFISH_MIN_KEY_BITS    ||
        keybits > MBEDTLS_BLOWFISH_MAX_KEY_BITS    ||
        keybits % 8 != 0 )
    {
        return( MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA );
    }

    keybits >>= 3;

    for( i = 0; i < 4; i++ )
    {
        for( j = 0; j < 256; j++ )
            ctx->S[i][j] = S[i][j];
    }

    j = 0;
    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS + 2; ++i )
    {
        data = 0x00000000;
        for( k = 0; k < 4; ++k )
        {
            data = ( data << 8 ) | key[j++];
            if( j >= keybits )
                j = 0;
        }
        ctx->P[i] = P[i] ^ data;
    }

    datal = 0x00000000;
    datar = 0x00000000;

    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS + 2; i += 2 )
    {
        blowfish_enc( ctx, &datal, &datar );
        ctx->P[i] = datal;
        ctx->P[i + 1] = datar;
    }

    for( i = 0; i < 4; i++ )
    {
       for( j = 0; j < 256; j += 2 )
       {
            blowfish_enc( ctx, &datal, &datar );
            ctx->S[i][j] = datal;
            ctx->S[i][j + 1] = datar;
        }
    }
    return( 0 );
}